

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
          (SmallVectorBase<slang::ConstantRange> *this,ConstantRange *args)

{
  ConstantRange *pCVar1;
  size_type sVar2;
  ulong uVar3;
  ConstantRange *pCVar4;
  ConstantRange *pCVar5;
  ConstantRange *pCVar6;
  ConstantRange CVar7;
  ConstantRange ctx;
  long lVar8;
  ConstantRange *pCVar9;
  
  pCVar9 = this->data_ + this->len;
  if (this->len != this->cap) {
    *pCVar9 = *args;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  CVar7 = (ConstantRange)(this->len + 1);
  uVar3 = this->cap;
  ctx = (ConstantRange)(uVar3 * 2);
  if ((ulong)CVar7 < (ulong)ctx) {
    CVar7 = ctx;
  }
  if (0xfffffffffffffff - uVar3 < uVar3) {
    CVar7.left = -1;
    CVar7.right = 0xfffffff;
  }
  lVar8 = (long)pCVar9 - (long)this->data_;
  pCVar4 = (ConstantRange *)operator_new((long)CVar7 * 8);
  *(ConstantRange *)((long)pCVar4 + lVar8) = *args;
  pCVar6 = this->data_;
  pCVar1 = pCVar6 + this->len;
  pCVar5 = pCVar4;
  if (pCVar1 == pCVar9) {
    for (; pCVar6 != pCVar9; pCVar6 = pCVar6 + 1) {
      *pCVar5 = *pCVar6;
      pCVar5 = pCVar5 + 1;
    }
  }
  else {
    for (; pCVar6 != pCVar9; pCVar6 = pCVar6 + 1) {
      ctx = *pCVar6;
      *pCVar5 = ctx;
      pCVar5 = pCVar5 + 1;
    }
    pCVar6 = (ConstantRange *)(lVar8 + (long)pCVar4);
    for (; pCVar6 = pCVar6 + 1, pCVar9 != pCVar1; pCVar9 = pCVar9 + 1) {
      *pCVar6 = *pCVar9;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)CVar7;
  this->data_ = pCVar4;
  return (reference)((long)pCVar4 + lVar8);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }